

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Offset<reflection::Type> __thiscall
flatbuffers::Type::Serialize(Type *this,FlatBufferBuilder *builder)

{
  unsigned_short e;
  BaseType BVar1;
  BaseType BVar2;
  uint e_00;
  size_t sVar3;
  uoffset_t uVar4;
  StructDef *pSVar5;
  uint e_01;
  int local_38;
  
  BVar1 = this->element;
  if ((ulong)BVar1 < 0x13) {
    e_01 = (uint)*(undefined8 *)(&DAT_00152290 + (ulong)BVar1 * 8);
    BVar2 = this->base_type;
    if ((BVar1 == BASE_TYPE_STRUCT && BVar2 == BASE_TYPE_VECTOR) &&
       (sVar3 = this->struct_def->bytesize, sVar3 != 0)) {
      e_01 = (uint)sVar3;
    }
    pSVar5 = this->struct_def;
    if ((pSVar5 == (StructDef *)0x0) &&
       (pSVar5 = (StructDef *)this->enum_def, pSVar5 == (StructDef *)0x0)) {
      local_38 = -1;
    }
    else {
      local_38 = (pSVar5->super_Definition).index;
    }
    if (BVar2 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) {
      e = this->fixed_length;
      e_00 = *(uint *)(&DAT_00152328 + (ulong)BVar2 * 4);
      FlatBufferBuilderImpl<false>::NotNested(builder);
      builder->nested = true;
      uVar4 = (builder->buf_).size_;
      FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(builder,0xe,e_01,0);
      FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(builder,0xc,e_00,4);
      FlatBufferBuilderImpl<false>::AddElement<int>(builder,8,local_38,-1);
      FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(builder,10,e,0);
      FlatBufferBuilderImpl<false>::AddElement<signed_char>(builder,6,(char)BVar1,'\0');
      FlatBufferBuilderImpl<false>::AddElement<signed_char>(builder,4,(char)BVar2,'\0');
      uVar4 = FlatBufferBuilderImpl<false>::EndTable(builder,uVar4);
      return (Offset<reflection::Type>)uVar4;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
}

Assistant:

Offset<reflection::Type> Type::Serialize(FlatBufferBuilder *builder) const {
  size_t element_size = SizeOf(element);
  if (base_type == BASE_TYPE_VECTOR && element == BASE_TYPE_STRUCT &&
      struct_def->bytesize != 0) {
    // struct_def->bytesize==0 means struct is table
    element_size = struct_def->bytesize;
  }
  return reflection::CreateType(
      *builder, static_cast<reflection::BaseType>(base_type),
      static_cast<reflection::BaseType>(element),
      struct_def ? struct_def->index : (enum_def ? enum_def->index : -1),
      fixed_length, static_cast<uint32_t>(SizeOf(base_type)),
      static_cast<uint32_t>(element_size));
}